

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int unixShmLock(sqlite3_file *fd,int ofst,int n,int flags)

{
  sqlite3_io_methods *psVar1;
  long lVar2;
  byte bVar3;
  bool bVar4;
  ushort uVar5;
  long lVar6;
  int local_5c;
  int ii_1;
  int bUnlock;
  int ii;
  int *aLock;
  u16 mask;
  int rc;
  unixShmNode *pShmNode;
  unixShm *p;
  unixFile *pDbFd;
  int flags_local;
  int n_local;
  int ofst_local;
  sqlite3_file *fd_local;
  
  aLock._4_4_ = 0;
  psVar1 = fd[8].pMethods;
  if (psVar1 == (sqlite3_io_methods *)0x0) {
    fd_local._4_4_ = 0x140a;
  }
  else {
    lVar2 = *(long *)psVar1;
    if (lVar2 == 0) {
      fd_local._4_4_ = 0x140a;
    }
    else {
      lVar6 = lVar2 + 0x40;
      bVar3 = (byte)ofst;
      uVar5 = (short)(1 << (bVar3 + (char)n & 0x1f)) - (short)(1 << (bVar3 & 0x1f));
      sqlite3_mutex_enter(*(sqlite3_mutex **)(lVar2 + 8));
      if ((flags & 1U) == 0) {
        local_5c = ofst;
        if ((flags & 4U) == 0) {
          for (; local_5c < ofst + n; local_5c = local_5c + 1) {
            if ((((uint)*(ushort *)((long)&psVar1->xRead + 4) & 1 << ((byte)local_5c & 0x1f)) == 0)
               && (*(int *)(lVar6 + (long)local_5c * 4) != 0)) {
              aLock._4_4_ = 5;
              break;
            }
          }
          if ((aLock._4_4_ == 0) &&
             (aLock._4_4_ = unixShmSystemLock((unixFile *)fd,1,ofst + 0x78,n), aLock._4_4_ == 0)) {
            *(ushort *)((long)&psVar1->xRead + 4) = *(ushort *)((long)&psVar1->xRead + 4) | uVar5;
            for (local_5c = ofst; local_5c < ofst + n; local_5c = local_5c + 1) {
              *(undefined4 *)(lVar6 + (long)local_5c * 4) = 0xffffffff;
            }
          }
        }
        else if ((*(ushort *)((long)&psVar1->xRead + 2) & uVar5) == 0) {
          if (*(int *)(lVar6 + (long)ofst * 4) < 0) {
            aLock._4_4_ = 5;
          }
          else if (*(int *)(lVar6 + (long)ofst * 4) == 0) {
            aLock._4_4_ = unixShmSystemLock((unixFile *)fd,0,ofst + 0x78,n);
          }
          if (aLock._4_4_ == 0) {
            *(ushort *)((long)&psVar1->xRead + 2) = *(ushort *)((long)&psVar1->xRead + 2) | uVar5;
            *(int *)(lVar6 + (long)ofst * 4) = *(int *)(lVar6 + (long)ofst * 4) + 1;
          }
        }
      }
      else if (((*(ushort *)((long)&psVar1->xRead + 4) | *(ushort *)((long)&psVar1->xRead + 2)) &
               uVar5) != 0) {
        bVar4 = true;
        for (ii_1 = ofst; ii_1 < ofst + n; ii_1 = ii_1 + 1) {
          if ((int)(uint)(((uint)*(ushort *)((long)&psVar1->xRead + 2) & 1 << ((byte)ii_1 & 0x1f))
                         != 0) < *(int *)(lVar6 + (long)ii_1 * 4)) {
            bVar4 = false;
          }
        }
        if (bVar4) {
          aLock._4_4_ = unixShmSystemLock((unixFile *)fd,2,ofst + 0x78,n);
          if (aLock._4_4_ == 0) {
            memset((void *)(lVar6 + (long)ofst * 4),0,(long)n << 2);
          }
        }
        else if (((uint)*(ushort *)((long)&psVar1->xRead + 2) & 1 << (bVar3 & 0x1f)) != 0) {
          *(int *)(lVar6 + (long)ofst * 4) = *(int *)(lVar6 + (long)ofst * 4) + -1;
        }
        if (aLock._4_4_ == 0) {
          *(ushort *)((long)&psVar1->xRead + 4) =
               *(ushort *)((long)&psVar1->xRead + 4) & (uVar5 ^ 0xffff);
          *(ushort *)((long)&psVar1->xRead + 2) =
               *(ushort *)((long)&psVar1->xRead + 2) & (uVar5 ^ 0xffff);
        }
      }
      sqlite3_mutex_leave(*(sqlite3_mutex **)(lVar2 + 8));
      fd_local._4_4_ = aLock._4_4_;
    }
  }
  return fd_local._4_4_;
}

Assistant:

static int unixShmLock(
  sqlite3_file *fd,          /* Database file holding the shared memory */
  int ofst,                  /* First lock to acquire or release */
  int n,                     /* Number of locks to acquire or release */
  int flags                  /* What to do with the lock */
){
  unixFile *pDbFd = (unixFile*)fd;      /* Connection holding shared memory */
  unixShm *p;                           /* The shared memory being locked */
  unixShmNode *pShmNode;                /* The underlying file iNode */
  int rc = SQLITE_OK;                   /* Result code */
  u16 mask;                             /* Mask of locks to take or release */
  int *aLock;

  p = pDbFd->pShm;
  if( p==0 ) return SQLITE_IOERR_SHMLOCK;
  pShmNode = p->pShmNode;
  if( NEVER(pShmNode==0) ) return SQLITE_IOERR_SHMLOCK;
  aLock = pShmNode->aLock;

  assert( pShmNode==pDbFd->pInode->pShmNode );
  assert( pShmNode->pInode==pDbFd->pInode );
  assert( ofst>=0 && ofst+n<=SQLITE_SHM_NLOCK );
  assert( n>=1 );
  assert( flags==(SQLITE_SHM_LOCK | SQLITE_SHM_SHARED)
       || flags==(SQLITE_SHM_LOCK | SQLITE_SHM_EXCLUSIVE)
       || flags==(SQLITE_SHM_UNLOCK | SQLITE_SHM_SHARED)
       || flags==(SQLITE_SHM_UNLOCK | SQLITE_SHM_EXCLUSIVE) );
  assert( n==1 || (flags & SQLITE_SHM_EXCLUSIVE)!=0 );
  assert( pShmNode->hShm>=0 || pDbFd->pInode->bProcessLock==1 );
  assert( pShmNode->hShm<0 || pDbFd->pInode->bProcessLock==0 );

  /* Check that, if this to be a blocking lock, no locks that occur later
  ** in the following list than the lock being obtained are already held:
  **
  **   1. Checkpointer lock (ofst==1).
  **   2. Write lock (ofst==0).
  **   3. Read locks (ofst>=3 && ofst<SQLITE_SHM_NLOCK).
  **
  ** In other words, if this is a blocking lock, none of the locks that
  ** occur later in the above list than the lock being obtained may be
  ** held.
  **
  ** It is not permitted to block on the RECOVER lock.
  */
#ifdef SQLITE_ENABLE_SETLK_TIMEOUT
  assert( (flags & SQLITE_SHM_UNLOCK) || pDbFd->iBusyTimeout==0 || (
         (ofst!=2)                                   /* not RECOVER */
      && (ofst!=1 || (p->exclMask|p->sharedMask)==0)
      && (ofst!=0 || (p->exclMask|p->sharedMask)<3)
      && (ofst<3  || (p->exclMask|p->sharedMask)<(1<<ofst))
  ));
#endif

  mask = (1<<(ofst+n)) - (1<<ofst);
  assert( n>1 || mask==(1<<ofst) );
  sqlite3_mutex_enter(pShmNode->pShmMutex);
  assert( assertLockingArrayOk(pShmNode) );
  if( flags & SQLITE_SHM_UNLOCK ){
    if( (p->exclMask|p->sharedMask) & mask ){
      int ii;
      int bUnlock = 1;

      for(ii=ofst; ii<ofst+n; ii++){
        if( aLock[ii]>((p->sharedMask & (1<<ii)) ? 1 : 0) ){
          bUnlock = 0;
        }
      }

      if( bUnlock ){
        rc = unixShmSystemLock(pDbFd, F_UNLCK, ofst+UNIX_SHM_BASE, n);
        if( rc==SQLITE_OK ){
          memset(&aLock[ofst], 0, sizeof(int)*n);
        }
      }else if( ALWAYS(p->sharedMask & (1<<ofst)) ){
        assert( n==1 && aLock[ofst]>1 );
        aLock[ofst]--;
      }

      /* Undo the local locks */
      if( rc==SQLITE_OK ){
        p->exclMask &= ~mask;
        p->sharedMask &= ~mask;
      }
    }
  }else if( flags & SQLITE_SHM_SHARED ){
    assert( n==1 );
    assert( (p->exclMask & (1<<ofst))==0 );
    if( (p->sharedMask & mask)==0 ){
      if( aLock[ofst]<0 ){
        rc = SQLITE_BUSY;
      }else if( aLock[ofst]==0 ){
        rc = unixShmSystemLock(pDbFd, F_RDLCK, ofst+UNIX_SHM_BASE, n);
      }

      /* Get the local shared locks */
      if( rc==SQLITE_OK ){
        p->sharedMask |= mask;
        aLock[ofst]++;
      }
    }
  }else{
    /* Make sure no sibling connections hold locks that will block this
    ** lock.  If any do, return SQLITE_BUSY right away.  */
    int ii;
    for(ii=ofst; ii<ofst+n; ii++){
      assert( (p->sharedMask & mask)==0 );
      if( ALWAYS((p->exclMask & (1<<ii))==0) && aLock[ii] ){
        rc = SQLITE_BUSY;
        break;
      }
    }

    /* Get the exclusive locks at the system level. Then if successful
    ** also update the in-memory values. */
    if( rc==SQLITE_OK ){
      rc = unixShmSystemLock(pDbFd, F_WRLCK, ofst+UNIX_SHM_BASE, n);
      if( rc==SQLITE_OK ){
        assert( (p->sharedMask & mask)==0 );
        p->exclMask |= mask;
        for(ii=ofst; ii<ofst+n; ii++){
          aLock[ii] = -1;
        }
      }
    }
  }
  assert( assertLockingArrayOk(pShmNode) );
  sqlite3_mutex_leave(pShmNode->pShmMutex);
  OSTRACE(("SHM-LOCK shmid-%d, pid-%d got %03x,%03x\n",
           p->id, osGetpid(0), p->sharedMask, p->exclMask));
  return rc;
}